

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.hpp
# Opt level: O2

item * __thiscall libtorrent::dht::item::operator=(item *this,item *param_1)

{
  long lVar1;
  public_key *ppVar2;
  public_key *ppVar3;
  byte bVar4;
  
  bVar4 = 0;
  entry::operator=(&this->m_value,&param_1->m_value);
  ::std::__cxx11::string::operator=((string *)&this->m_salt,(string *)&param_1->m_salt);
  ppVar2 = &param_1->m_pk;
  ppVar3 = &this->m_pk;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)(ppVar3->bytes)._M_elems = *(undefined8 *)(ppVar2->bytes)._M_elems;
    ppVar2 = (public_key *)((long)ppVar2 + (ulong)bVar4 * -0x10 + 8);
    ppVar3 = (public_key *)((long)ppVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (this->m_seq).value = (param_1->m_seq).value;
  this->m_mutable = param_1->m_mutable;
  return this;
}

Assistant:

class TORRENT_EXTRA_EXPORT item
{
public:
	item() {}
	item(public_key const& pk, span<char const> salt);
	explicit item(entry v);
	item(entry v
		, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, secret_key const& sk);
	explicit item(bdecode_node const& v);

	void assign(entry v);
	void assign(entry v, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, secret_key const& sk);
	void assign(bdecode_node const& v);
	bool assign(bdecode_node const& v, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, signature const& sig);
	void assign(entry v, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, signature const& sig);

	void clear() { m_value = entry(); }
	bool empty() const { return m_value.type() == entry::undefined_t; }

	bool is_mutable() const { return m_mutable; }

	entry const& value() const { return m_value; }
	public_key const& pk() const
	{ return m_pk; }
	signature const& sig() const
	{ return m_sig; }
	sequence_number seq() const { return m_seq; }
	std::string const& salt() const { return m_salt; }

private:
	entry m_value;
	std::string m_salt;
	public_key m_pk;
	signature m_sig;
	sequence_number m_seq{0};
	bool m_mutable = false;
}